

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SlaterIntegrals.hpp
# Opt level: O2

RealType RosenA(int n,RealType a)

{
  int iVar1;
  bool bVar2;
  RealType RVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  
  RVar3 = 0.0;
  if ((a != 0.0) || (NAN(a))) {
    iVar1 = 0;
    if (0 < n) {
      iVar1 = n;
    }
    dVar7 = 1.0;
    dVar8 = 1.0;
    dVar4 = 1.0;
    while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
      dVar8 = dVar8 * (a / dVar4);
      dVar7 = dVar7 + dVar8;
      dVar4 = dVar4 + 1.0;
    }
    dVar4 = exp(-a);
    auVar5._8_8_ = dVar4;
    auVar5._0_8_ = dVar7;
    auVar6._8_8_ = a;
    auVar6._0_8_ = dVar8;
    auVar6 = divpd(auVar5,auVar6);
    RVar3 = auVar6._8_8_ * auVar6._0_8_;
  }
  return RVar3;
}

Assistant:

inline RealType RosenA(int n, RealType a) {
  RealType RosenA_ = 0.;
  if (a != 0.) {
    RealType Term = 1.;
    RosenA_       = Term;
    for (int nu = 1; nu <= n; nu++) {
      Term *= a / nu;
      RosenA_ += Term;
    }
    RosenA_ = (RosenA_ / Term) * (exp(-a) / a);
  }
  return RosenA_;
}